

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

HRESULT __thiscall
Js::SourceTextModuleRecord::ParseSource
          (SourceTextModuleRecord *this,byte *sourceText,uint32 sourceLength,SRCINFO *srcInfo,
          Var *exceptionVar,bool isUtf8)

{
  size_t count;
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  HRESULT HVar5;
  Data DVar6;
  undefined4 *puVar7;
  char16 *pcVar8;
  Parser *pPVar9;
  ParseNodeProg *ptr;
  size_t count_00;
  Recycler *this_00;
  char16_t *dest;
  JavascriptError *pJVar10;
  void *__frameAddr;
  undefined7 in_register_00000089;
  undefined1 auStack_e8 [8];
  CompileScriptException se;
  undefined1 local_80 [8];
  Utf8SourceInfo *pResultSourceInfo;
  size_t local_70;
  char *local_68;
  Data local_60;
  ArenaAllocator *local_58;
  uint local_4c;
  AutoNestedHandledExceptionType local_48;
  uint32 local_44;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  local_4c = (uint)CONCAT71(in_register_00000089,isUtf8);
  local_44 = sourceLength;
  if ((sourceText != (byte *)0x0) && (this->wasParsed != false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x52,"(!wasParsed || sourceText == nullptr)",
                                "!wasParsed || sourceText == nullptr");
    if (!bVar4) goto LAB_009e740e;
    *puVar7 = 0;
  }
  if (this->parser != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x53,"(parser == nullptr)","parser == nullptr");
    if (!bVar4) goto LAB_009e740e;
    *puVar7 = 0;
  }
  if (exceptionVar == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x54,"(exceptionVar != nullptr)","exceptionVar != nullptr");
    if (!bVar4) goto LAB_009e740e;
    *puVar7 = 0;
  }
  if ((sourceText == (byte *)0x0) && (this->wasParsed != false)) {
    return 0;
  }
  scriptContext = (this->scriptContext).ptr;
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  auStack_e8._0_4_ = 0;
  auStack_e8._4_4_ = 0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  *exceptionVar = (Var)0x0;
  ___autoNestedHandledExceptionType = exceptionVar;
  if (((scriptContext->config).threadConfig)->m_ES6Module == false) {
    pJVar10 = JavascriptLibrary::CreateError
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessageProperties(pJVar10,0,L"ES6Module not supported",scriptContext);
    *exceptionVar = pJVar10;
    HVar5 = -0x7fffbfff;
    goto LAB_009e73ed;
  }
  if ((this->promise).ptr == (JavascriptPromise *)0x0 &&
      (this->parentModuleList).ptr ==
      (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    this->isRootModule = true;
  }
  local_58 = &scriptContext->generalAllocator;
  if (sourceText == (byte *)0x0) {
    if (local_44 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x73,"(sourceLength == 0)","sourceLength == 0");
      if (!bVar4) {
LAB_009e740e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    pcVar8 = GetSpecifierSz(this);
    Output::TraceWithFlush(ModulePhase,L"Failed to load: %s\n",pcVar8);
    pcVar8 = GetSpecifierSz(this);
    count_00 = PAL_wcslen(pcVar8);
    count = count_00 + 1;
    local_80 = (undefined1  [8])&char16_t::typeinfo;
    pResultSourceInfo = (Utf8SourceInfo *)0x0;
    local_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
    ;
    local_60.handledExceptionType = 0x7a;
    local_70 = count;
    this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_80);
    dest = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
    wmemcpy_s(dest,count,pcVar8,count_00);
    dest[count_00] = L'\0';
    pJVar10 = JavascriptLibrary::CreateURIError
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    HVar5 = -0x7fffbffb;
    JavascriptError::SetErrorMessageProperties(pJVar10,-0x7fffbffb,dest,scriptContext);
    *___autoNestedHandledExceptionType = pJVar10;
  }
  else {
    pcVar8 = GetSpecifierSz(this);
    Output::TraceWithFlush(ModulePhase,L"ParseSource(%s)\n",pcVar8);
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    pPVar9 = (Parser *)new<Memory::ArenaAllocator>(0xaa8,local_58,0x35916e);
    Parser::Parser(pPVar9,scriptContext,0,(PageAllocator *)0x0,false,0xaa8);
    this->parser = pPVar9;
    srcInfo->moduleID = this->moduleId;
    local_80 = (undefined1  [8])0x0;
    ptr = ScriptContext::ParseScript
                    (scriptContext,pPVar9,sourceText,(ulong)local_44,srcInfo,
                     (CompileScriptException *)auStack_e8,(Utf8SourceInfo **)local_80,L"Module code"
                     ,(local_4c & 0xff) << 6 |
                      (LoadScriptFlag_Module|LoadScriptFlag_disableAsmJs|LoadScriptFlag_Expression),
                     &this->sourceIndex,(Var)0x0);
    Memory::WriteBarrierPtr<ParseNodeProg>::WriteBarrierSet(&this->parseTree,ptr);
    Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::WriteBarrierSet
              (&this->pSourceInfo,(Utf8SourceInfo *)local_80);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_48);
    if ((this->parseTree).ptr == (ParseNodeProg *)0x0) {
      HVar5 = -0x7fffbffb;
    }
    else {
      HVar5 = PostParseProcess(this);
      if (HVar5 == 0) {
        pvVar2 = (this->errorObject).ptr;
        HVar5 = 0;
        if ((pvVar2 != (void *)0x0) && (this->hadNotifyHostReady == true)) {
          if (*___autoNestedHandledExceptionType == (Var)0x0) {
            *___autoNestedHandledExceptionType = pvVar2;
          }
          HVar5 = -0x7fffbffb;
          ReleaseParserResourcesForHierarchy(this);
        }
        goto LAB_009e73ed;
      }
      if (-1 < HVar5) goto LAB_009e73ed;
    }
    pJVar10 = (JavascriptError *)*___autoNestedHandledExceptionType;
  }
  if (pJVar10 == (JavascriptError *)0x0) {
    pcVar8 = GetSpecifierSz(this);
    pJVar10 = JavascriptError::CreateFromCompileScriptException
                        (scriptContext,(CompileScriptException *)auStack_e8,pcVar8);
    *___autoNestedHandledExceptionType = pJVar10;
  }
  ReleaseParserResourcesForHierarchy(this);
  pPVar9 = this->parser;
  if (pPVar9 != (Parser *)0x0) {
    (this->parseTree).ptr = (ParseNodeProg *)0x0;
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Parser>
              (local_58,pPVar9);
    this->parser = (Type)0x0;
  }
  if ((this->errorObject).ptr == (void *)0x0) {
    Memory::WriteBarrierPtr<void>::WriteBarrierSet
              (&this->errorObject,*___autoNestedHandledExceptionType);
  }
  if ((this->promise).ptr != (JavascriptPromise *)0x0) {
    ResolveOrRejectDynamicImportPromise
              (false,(this->errorObject).ptr,(this->scriptContext).ptr,this,false);
  }
  if ((this->isRootModule == true) && (this->hadNotifyHostReady == false)) {
    pcVar8 = GetSpecifierSz(this);
    Output::TraceWithFlush
              (ModulePhase,L"\t>NotifyHostAboutModuleReady %s (ParseSource error)\n",pcVar8);
    if (scriptContext->threadContext->isScriptActive == true) {
      LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)local_80,scriptContext,
                 &stack0xfffffffffffffff8);
      pTVar1 = scriptContext->threadContext;
      bVar4 = pTVar1->reentrancySafeOrHandled;
      pTVar1->reentrancySafeOrHandled = true;
      (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
      ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
      pTVar1->reentrancySafeOrHandled = bVar4;
      LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)local_80);
    }
    else {
      DVar6 = ExceptionCheck::Save();
      local_80._0_4_ = DVar6.handledExceptionType;
      (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
      ExceptionCheck::Restore((Data *)local_80);
    }
    this->hadNotifyHostReady = true;
  }
  Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentAsNeeded\n");
  NotifyParentsAsNeeded(this);
LAB_009e73ed:
  CompileScriptException::~CompileScriptException((CompileScriptException *)auStack_e8);
  return HVar5;
}

Assistant:

HRESULT SourceTextModuleRecord::ParseSource(__in_bcount(sourceLength) byte* sourceText, uint32 sourceLength, SRCINFO * srcInfo, Var* exceptionVar, bool isUtf8)
    {
        Assert(!wasParsed || sourceText == nullptr);
        Assert(parser == nullptr);
        Assert(exceptionVar != nullptr);
        HRESULT hr = NOERROR;

        // Return if loading failure has been reported
        if (sourceText == nullptr && wasParsed)
        {
            return hr;
        }

        ScriptContext* scriptContext = GetScriptContext();
        CompileScriptException se;
        ArenaAllocator* allocator = scriptContext->GeneralAllocator();
        *exceptionVar = nullptr;
        if (!scriptContext->GetConfig()->IsES6ModuleEnabled())
        {
            JavascriptError *pError = scriptContext->GetLibrary()->CreateError();
            JavascriptError::SetErrorMessageProperties(pError, hr, _u("ES6Module not supported"), scriptContext);
            *exceptionVar = pError;
            return E_NOTIMPL;
        }

        // Mark module as root module if it currently has no parents
        // Note, if there are circular imports it may gain parents later
        if (parentModuleList == nullptr && promise == nullptr)
        {
            SetIsRootModule();
        }

        // Host indicates that the current module failed to load.
        if (sourceText == nullptr)
        {
            Assert(sourceLength == 0);
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("Failed to load: %s\n"), this->GetSpecifierSz());
            hr = E_FAIL;

            // We cannot just use the buffer in the specifier string - need to make a copy here.
            const char16* moduleName = this->GetSpecifierSz();
            size_t length = wcslen(moduleName);
            char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
            wmemcpy_s(allocatedString, length + 1, moduleName, length);
            allocatedString[length] = _u('\0');

            JavascriptError *pError = scriptContext->GetLibrary()->CreateURIError();
            JavascriptError::SetErrorMessageProperties(pError, hr, allocatedString, scriptContext);
            *exceptionVar = pError;
        }
        else
        {
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ParseSource(%s)\n"), this->GetSpecifierSz());
            try
            {
                AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
                this->parser = Anew(allocator, Parser, scriptContext);
                srcInfo->moduleID = moduleId;

                LoadScriptFlag loadScriptFlag = (LoadScriptFlag)(LoadScriptFlag_Expression | LoadScriptFlag_Module |
                    LoadScriptFlag_disableAsmJs | (isUtf8 ? LoadScriptFlag_Utf8Source : LoadScriptFlag_None));

                Utf8SourceInfo* pResultSourceInfo = nullptr;
                this->parseTree = scriptContext->ParseScript(parser, sourceText,
                    sourceLength, srcInfo, &se, &pResultSourceInfo, Constants::ModuleCode,
                    loadScriptFlag, &sourceIndex, nullptr);
                this->pSourceInfo = pResultSourceInfo;
            }
            catch (Js::OutOfMemoryException)
            {
                hr = E_OUTOFMEMORY;
            }
            catch (Js::StackOverflowException)
            {
                hr = VBSERR_OutOfStack;
            }

            if (FAILED(hr))
            {
                se.ProcessError(nullptr, hr, nullptr);
            }
            else if (parseTree == nullptr)
            {
                hr = E_FAIL;
            }
            else
            {
                hr = PostParseProcess();
                if (hr == S_OK && this->errorObject != nullptr && this->hadNotifyHostReady)
                {
                    // This would be the case where the child module got error and current module has notified error already.
                    if (*exceptionVar == nullptr)
                    {
                        *exceptionVar = this->errorObject;
                    }

                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                    return E_FAIL;
                }
            }
        }

        if (FAILED(hr))
        {
            if (*exceptionVar == nullptr)
            {
                const WCHAR * sourceUrl = this->GetSpecifierSz();

                *exceptionVar = JavascriptError::CreateFromCompileScriptException(scriptContext, &se, sourceUrl);
            }
            // Cleanup in case of error.
            this->ReleaseParserResourcesForHierarchy();
            if (this->parser)
            {
                this->parseTree = nullptr;
                Adelete(allocator, this->parser);
                this->parser = nullptr;
            }
            if (this->errorObject == nullptr)
            {
                this->errorObject = *exceptionVar;
            }

            if (this->promise != nullptr)
            {
                SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, this->errorObject, this->scriptContext, this, false);
            }

            // Notify host if current module is root module and the host hasn't been notified
            if (isRootModule && !hadNotifyHostReady)
            {
                OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (ParseSource error)\n"), this->GetSpecifierSz());
                LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                {
                    scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                });

                hadNotifyHostReady = true;
            }

            // Notify parent if applicable
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentAsNeeded\n"));
            NotifyParentsAsNeeded();
        }
        return hr;
    }